

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RenditionAdapterBlendsAllowedPixelRegionsWithNoLimitations
          (RendererTests *this)

{
  allocator local_1f5;
  uint8_t covers2 [3];
  short covers1 [4];
  string local_1e8;
  blender<unsigned_char,_unsigned_char> blender2;
  blender<int,_short> blender1;
  LocationInfo local_190;
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_> r1;
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  r2;
  bitmap<unsigned_char,_0UL,_0UL> bitmap2;
  bitmap<int,_0UL,_0UL> bitmap1;
  uint8_t reference2 [20];
  int reference1 [35];
  
  covers1[0] = 0x1001;
  covers1[1] = 2;
  covers1[2] = 0x4003;
  covers1[3] = 0xe2;
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocks::bitmap<int,_0UL,_0UL>::bitmap(&bitmap1,7,5);
  r1._blender = &blender1;
  r1._offset.dx = 0;
  r1._offset.dy = 0;
  r1._window.x1 = 0;
  r1._window.y1 = 0;
  r1._window.x2 = bitmap1._width;
  r1._window.y2 = bitmap1._height;
  covers2[2] = 0x91;
  covers2[0] = 0xed;
  covers2[1] = '\b';
  blender2.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender2.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blender2.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r1._bitmap = &bitmap1;
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&bitmap2,5,4);
  r2._blender = &blender2;
  r2._offset.dx = 0;
  r2._offset.dy = 0;
  r2._window.x1 = 0;
  r2._window.y1 = 0;
  r2._window.x2 = bitmap2._width;
  r2._window.y2 = bitmap2._height;
  r2._bitmap = &bitmap2;
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  set_y(&r1,0);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  operator()(&r1,0,3,covers1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  set_y(&r1,1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  operator()(&r1,0,2,covers1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  set_y(&r1,4);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  operator()(&r1,3,4,covers1);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y(&r2,2);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r2,4,1,covers2);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r2,1,3,covers2);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y(&r2,3);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r2,2,3,covers2);
  memcpy(reference1,&DAT_001a89c0,0x8c);
  reference2[0] = '\0';
  reference2[1] = '\0';
  reference2[2] = '\0';
  reference2[3] = '\0';
  reference2[4] = '\0';
  reference2[5] = '\0';
  reference2[6] = '\0';
  reference2[7] = '\0';
  reference2[8] = '\0';
  reference2[9] = '\0';
  reference2[10] = '\0';
  reference2[0xb] = 0xed;
  reference2[0xc] = '\b';
  reference2[0xd] = 0x91;
  reference2[0xe] = 0xed;
  reference2[0xf] = '\0';
  reference2[0x10] = '\0';
  reference2[0x11] = 0xed;
  reference2[0x12] = '\b';
  reference2[0x13] = 0x91;
  std::__cxx11::string::string
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1f5);
  ut::LocationInfo::LocationInfo(&local_190,&local_1e8,0x290);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>(&reference1,&bitmap1.data,&local_190)
  ;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1f5);
  ut::LocationInfo::LocationInfo(&local_190,&local_1e8,0x291);
  ut::are_equal<unsigned_char,20ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&reference2,&bitmap2.data,&local_190);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bitmap2);
  std::
  _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                   *)&blender2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&bitmap1);
  std::
  _Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
                   *)&blender1);
  return;
}

Assistant:

test( RenditionAdapterBlendsAllowedPixelRegionsWithNoLimitations )
			{
				// INIT
				short covers1[] = { 0x1001, 0x0002, 0x4003, 0x00E2, };
				mocks::blender<int, short> blender1;
				mocks::bitmap<int> bitmap1(7, 5);
				renderer::adapter< mocks::bitmap<int>, mocks::blender<int, short> > r1(bitmap1, zero(), 0, blender1);

				uint8_t covers2[] = { 0xED, 0x08, 0x91, };
				mocks::blender<uint8_t, uint8_t> blender2;
				mocks::bitmap<uint8_t> bitmap2(5, 4);
				renderer::adapter< mocks::bitmap<uint8_t>, mocks::blender<uint8_t, uint8_t> > r2(bitmap2, zero(), 0, blender2);

				// ACT
				r1.set_y(0);
				r1(0, 3, covers1);
				
				r1.set_y(1);
				r1(0, 2, covers1);
				
				r1.set_y(4);
				r1(3, 4, covers1);

				r2.set_y(2);
				r2(4, 1, covers2);
				r2(1, 3, covers2);
				
				r2.set_y(3);
				r2(2, 3, covers2);

				// ASSERT
				int reference1[] = {
					0x00001001, 0x00000002, 0x00004003, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x01001001, 0x01000002, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x04031001, 0x04030002, 0x04034003, 0x040300E2,
				};
				uint8_t reference2[] = {
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0xED, 0x08, 0x91, 0xED,
					0x00, 0x00, 0xED, 0x08, 0x91,
				};

				assert_equal(reference1, bitmap1.data);
				assert_equal(reference2, bitmap2.data);
			}